

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O2

void __thiscall QStyleAnimation::updateCurrentTime(QStyleAnimation *this,int time)

{
  char cVar1;
  int iVar2;
  
  iVar2 = *(int *)(this + 0x20);
  *(int *)(this + 0x20) = iVar2 + 1;
  if ((iVar2 + 1 < *(int *)(this + 0x1c)) &&
     (iVar2 = (**(code **)(*(long *)this + 0x60))(this), time < iVar2)) {
    return;
  }
  *(undefined4 *)(this + 0x20) = 0;
  if ((*(long *)(*(long *)(this + 8) + 0x10) != 0) &&
     (cVar1 = (**(code **)(*(long *)this + 0x80))(this), cVar1 != '\0')) {
    updateTarget(this);
    return;
  }
  return;
}

Assistant:

void QStyleAnimation::updateCurrentTime(int time)
{
    if (++_skip >= _fps || time >= duration()) {
        _skip = 0;
        if (target() && isUpdateNeeded())
            updateTarget();
    }
}